

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O0

SquareMatrix3<double> * __thiscall
OpenMD::SquareMatrix3<double>::transpose(SquareMatrix3<double> *this)

{
  double dVar1;
  double *pdVar2;
  long in_RSI;
  RectMatrix<double,_3U,_3U> *in_RDI;
  uint j;
  uint i;
  SquareMatrix3<double> *result;
  undefined4 local_1c;
  undefined4 local_18;
  
  SquareMatrix3((SquareMatrix3<double> *)0x17c4bf);
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      dVar1 = *(double *)(in_RSI + (ulong)local_18 * 0x18 + (ulong)local_1c * 8);
      pdVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,local_1c,local_18);
      *pdVar2 = dVar1;
    }
  }
  return (SquareMatrix3<double> *)in_RDI;
}

Assistant:

SquareMatrix3<Real> transpose() const {
      SquareMatrix3<Real> result;

      for (unsigned int i = 0; i < 3; i++)
        for (unsigned int j = 0; j < 3; j++)
          result(j, i) = this->data_[i][j];

      return result;
    }